

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

int __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::FileZoneInfoSource::Skip
          (FileZoneInfoSource *this,size_t offset)

{
  int iVar1;
  
  if (this->len_ < offset) {
    offset = this->len_;
  }
  iVar1 = fseek((FILE *)(this->fp_)._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,offset,1);
  if (iVar1 == 0) {
    this->len_ = this->len_ - offset;
  }
  return iVar1;
}

Assistant:

int Skip(std::size_t offset) override {
    offset = std::min(offset, len_);
    int rc = fseek(fp_.get(), static_cast<long>(offset), SEEK_CUR);
    if (rc == 0) len_ -= offset;
    return rc;
  }